

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

void __thiscall jbcoin::STObject::setFieldVL(STObject *this,SField *field,Blob *v)

{
  pointer data;
  Buffer BStack_28;
  
  data = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  Buffer::Buffer(&BStack_28,data,
                 (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)data);
  setFieldUsingSetValue<jbcoin::STBlob,jbcoin::Buffer>(this,field,&BStack_28);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&BStack_28.p_);
  return;
}

Assistant:

void STObject::setFieldVL (SField const& field, Blob const& v)
{
    setFieldUsingSetValue <STBlob> (field, Buffer(v.data (), v.size ()));
}